

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uuid.cpp
# Opt level: O3

void __thiscall BasicUUID_String_Test::TestBody(BasicUUID_String_Test *this)

{
  char *message;
  AssertHelper local_40;
  internal local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  string local_28;
  
  pstore::uuid::str_abi_cxx11_(&local_28,&(this->super_BasicUUID).id_);
  testing::internal::CmpHelperEQ<char[37],std::__cxx11::string>
            (local_38,"\"84949cc5-4701-4a84-895b-354c584a981b\"","id_.str ()",
             (char (*) [37])"84949cc5-4701-4a84-895b-354c584a981b",&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_uuid.cpp"
               ,0x30,message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((long *)local_28._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_28._M_dataplus._M_p + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  return;
}

Assistant:

TEST_F (BasicUUID, String) {
    EXPECT_EQ ("84949cc5-4701-4a84-895b-354c584a981b", id_.str ());
}